

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip_high_compression.c
# Opt level: O2

void test_read_format_zip_high_compression2(void)

{
  void *buff;
  void *buff_00;
  int iVar1;
  char *pcVar2;
  archive_conflict *a;
  la_ssize_t v2;
  archive *a_00;
  ulong uVar3;
  archive_entry *entry;
  size_t s;
  void *local_60;
  void *local_58;
  int64_t o;
  size_t used;
  ulong local_40;
  void *pv;
  
  pcVar2 = archive_zlib_version();
  if (pcVar2 != (char *)0x0) {
    local_60 = malloc(0x100000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                     ,L']',(uint)(local_60 != (void *)0x0),"(body = malloc(body_size)) != NULL",
                     (void *)0x0);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                     ,L'^',L'\x01',"(body_read = malloc(body_size)) != NULL",(void *)0x0);
    local_58 = malloc(0x200000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                     ,L'_',(uint)(local_58 != (void *)0x0),"(buff = malloc(buff_size)) != NULL",
                     (void *)0x0);
    for (uVar3 = 0x400; buff = local_60, uVar3 < 0x100000; uVar3 = uVar3 + 0x400) {
      used = 0;
      memset(local_60,0xff,0x100000);
      *(undefined1 *)((long)buff + uVar3) = 1;
      a = (archive_conflict *)archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                       ,L's',(uint)(a != (archive_conflict *)0x0),
                       "(a = archive_write_new()) != NULL",(void *)0x0);
      iVar1 = archive_write_set_format_zip((archive *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L't',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                          (void *)0x0);
      buff_00 = local_58;
      local_40 = uVar3;
      iVar1 = archive_write_open_memory((archive *)a,local_58,0x200000,&used);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'u',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, buff_size, &used)",(void *)0x0);
      entry = archive_entry_new2(a);
      archive_entry_set_pathname(entry,"test");
      archive_entry_set_filetype(entry,0x8000);
      archive_entry_set_size(entry,0x40006);
      iVar1 = archive_write_header((archive *)a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'{',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free(entry);
      v2 = archive_write_data((archive *)a,buff,0x40006);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'}',0x40006,"262150",v2,"archive_write_data(a, body, 262150)",
                          (void *)0x0);
      iVar1 = archive_write_free((archive *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'~',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      a_00 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                       ,L'\x81',(uint)(a_00 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_format_all(a_00);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x82',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          a_00);
      iVar1 = archive_read_support_filter_all(a_00);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x83',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                          a_00);
      iVar1 = read_open_memory(a_00,buff_00,used,0x11);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x84',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory(a, buff, used, 17)",
                          a_00);
      iVar1 = archive_read_next_header(a_00,&entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x85',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &entry)",
                          (void *)0x0);
      iVar1 = archive_read_data_block(a_00,&pv,&s,&o);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x87',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_read_data_block(a, &pv, &s, &o)",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x88',0x40000,"262144",s,"s",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x89',0,"0",o,"o",(void *)0x0);
      iVar1 = archive_read_data_block(a_00,&pv,&s,&o);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x8b',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_read_data_block(a, &pv, &s, &o)",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x8c',6,"6",s,"s",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x8d',0x40000,"262144",o,"o",(void *)0x0);
      uVar3 = local_40;
      iVar1 = archive_read_data_block(a_00,&pv,&s,&o);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x8f',1,"ARCHIVE_EOF",(long)iVar1,
                          "archive_read_data_block(a, &pv, &s, &o)",(void *)0x0);
      iVar1 = archive_free(a_00);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                          ,L'\x91',0,"ARCHIVE_OK",(long)iVar1,"archive_free(a)",(void *)0x0);
    }
    free(local_60);
    free(local_58);
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_high_compression.c"
                 ,L'Y');
  test_skipping("Zip compression test requires zlib");
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_high_compression2)
{
	const size_t body_size = 1024 * 1024;
	const size_t buff_size = 2 * 1024 * 1024;
	char *body, *body_read, *buff;
	int n;

	if (archive_zlib_version() == NULL) {
		skipping("Zip compression test requires zlib");
		return;
	}

	assert((body = malloc(body_size)) != NULL);
	assert((body_read = malloc(body_size)) != NULL);
	assert((buff = malloc(buff_size)) != NULL);

	/* Highly-compressible data: all bytes 255, except for a
	 * single 1 byte.
	 * The body is always 256k + 6 bytes long (the internal deflation
	 * buffer is exactly 256k).
	 */

	for(n = 1024; n < (int)body_size; n += 1024) {
		struct archive *a;
		struct archive_entry *entry;
		size_t used = 0;
		const void *pv;
		size_t s;
		int64_t o;

		memset(body, 255, body_size);
		body[n] = 1;

		/* Write an archive with a single entry of n bytes. */
		assert((a = archive_write_new()) != NULL);
		assertEqualInt(ARCHIVE_OK, archive_write_set_format_zip(a));
		assertEqualInt(ARCHIVE_OK, archive_write_open_memory(a, buff, buff_size, &used));

		entry = archive_entry_new2(a);
		archive_entry_set_pathname(entry, "test");
		archive_entry_set_filetype(entry, AE_IFREG);
		archive_entry_set_size(entry, 262150);
		assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
		archive_entry_free(entry);
		assertEqualInt(262150, archive_write_data(a, body, 262150));
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));

		/* Read back the entry and verify the contents. */
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK, read_open_memory(a, buff, used, 17));
		assertEqualInt(ARCHIVE_OK, archive_read_next_header(a, &entry));

		assertEqualInt(ARCHIVE_OK, archive_read_data_block(a, &pv, &s, &o));
		assertEqualInt(262144, s);
		assertEqualInt(0, o);

		assertEqualInt(ARCHIVE_OK, archive_read_data_block(a, &pv, &s, &o));
		assertEqualInt(6, s);
		assertEqualInt(262144, o);

		assertEqualInt(ARCHIVE_EOF, archive_read_data_block(a, &pv, &s, &o));

		assertEqualInt(ARCHIVE_OK, archive_free(a));
	}

	free(body);
	free(body_read);
	free(buff);
}